

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testloadso.c
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  FILE *pFVar2;
  int iVar3;
  undefined8 uVar4;
  long lVar5;
  code *pcVar6;
  char *app;
  fntype fn;
  void *lib;
  char *symname;
  char *libname;
  int hello;
  int retval;
  char **argv_local;
  int argc_local;
  
  libname._4_4_ = 0;
  if (argc == 3) {
    iVar3 = SDL_Init(0);
    pFVar2 = _stderr;
    if (iVar3 < 0) {
      uVar4 = SDL_GetError();
      fprintf(pFVar2,"Couldn\'t initialize SDL: %s\n",uVar4);
      argv_local._4_4_ = 2;
    }
    else {
      iVar3 = strcmp(argv[1],"--hello");
      if (iVar3 != 0) {
        symname = argv[1];
        lib = argv[2];
      }
      else {
        symname = argv[2];
        lib = anon_var_dwarf_83;
      }
      lVar5 = SDL_LoadObject(symname);
      pFVar2 = _stderr;
      if (lVar5 == 0) {
        uVar4 = SDL_GetError();
        fprintf(pFVar2,"SDL_LoadObject(\'%s\') failed: %s\n",symname,uVar4);
        libname._4_4_ = 3;
      }
      else {
        pcVar6 = (code *)SDL_LoadFunction(lVar5,lib);
        pFVar2 = _stderr;
        if (pcVar6 == (code *)0x0) {
          uVar4 = SDL_GetError();
          fprintf(pFVar2,"SDL_LoadFunction(\'%s\') failed: %s\n",lib,uVar4);
          libname._4_4_ = 4;
        }
        else {
          printf("Found %s in %s at %p\n",lib,symname,pcVar6);
          if (iVar3 == 0) {
            printf("Calling function...\n");
            fflush(_stdout);
            (*pcVar6)("     HELLO, WORLD!\n");
            printf("...apparently, we survived.  :)\n");
            printf("Unloading library...\n");
            fflush(_stdout);
          }
        }
        SDL_UnloadObject(lVar5);
      }
      SDL_Quit();
      argv_local._4_4_ = libname._4_4_;
    }
  }
  else {
    pcVar1 = *argv;
    fprintf(_stderr,"USAGE: %s <library> <functionname>\n",pcVar1);
    fprintf(_stderr,"       %s --hello <lib with puts()>\n",pcVar1);
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[])
{
	int retval = 0;
	int hello = 0;
	const char *libname = NULL;
	const char *symname = NULL;
	void *lib = NULL;
	fntype fn = NULL;

	if (argc != 3) {
		const char *app = argv[0];
		fprintf(stderr, "USAGE: %s <library> <functionname>\n", app);
		fprintf(stderr, "       %s --hello <lib with puts()>\n", app);
		return 1;
	}

	/* Initialize SDL */
	if ( SDL_Init(0) < 0 ) {
		fprintf(stderr, "Couldn't initialize SDL: %s\n",SDL_GetError());
		return 2;
	}

	if (strcmp(argv[1], "--hello") == 0) {
		hello = 1;
		libname = argv[2];
		symname = "puts";
	} else {
		libname = argv[1];
		symname = argv[2];
	}

	lib = SDL_LoadObject(libname);
        if (lib == NULL) {
		fprintf(stderr, "SDL_LoadObject('%s') failed: %s\n",
		        libname, SDL_GetError());
		retval = 3;
	} else {
		fn = (fntype) SDL_LoadFunction(lib, symname);
		if (fn == NULL) {
			fprintf(stderr, "SDL_LoadFunction('%s') failed: %s\n",
			        symname, SDL_GetError());
			retval = 4;
		} else {
			printf("Found %s in %s at %p\n", symname, libname, fn);
			if (hello) {
				printf("Calling function...\n");
				fflush(stdout);
				fn("     HELLO, WORLD!\n");
				printf("...apparently, we survived.  :)\n");
				printf("Unloading library...\n");
				fflush(stdout);
			}
		}
		SDL_UnloadObject(lib);
	}
	SDL_Quit();
	return retval;
}